

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,double4 *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *p_Var2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = "(";
  poVar1 = std::operator<<(os,"(");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)this,v->_M_elems[0]);
  poVar1 = std::operator<<(poVar1,(string *)&local_b0);
  p_Var2 = (_anonymous_namespace_ *)0x20f7e6;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_50,p_Var2,v->_M_elems[1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  p_Var2 = (_anonymous_namespace_ *)0x20f7e6;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_70,p_Var2,v->_M_elems[2]);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  p_Var2 = (_anonymous_namespace_ *)0x20f7e6;
  poVar1 = std::operator<<(poVar1,", ");
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_90,p_Var2,v->_M_elems[3]);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,")");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::double4 &v) {
  os << "(" << tinyusdz::dtos(v[0]) << ", " << tinyusdz::dtos(v[1]) << ", "
     << tinyusdz::dtos(v[2]) << ", " << tinyusdz::dtos(v[3]) << ")";
  return os;
}